

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTPNList::gen_code(CTPNList *this,int discard,int for_condition)

{
  int iVar1;
  CTPNListEleBase *this_00;
  ulong in_RCX;
  undefined4 in_EDX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int in_ESI;
  CTPNListBase *in_RDI;
  CTcGenTarg *unaff_retaddr;
  CTPNListEle *ele;
  uchar in_stack_0000008f;
  CTcGenTarg *in_stack_00000090;
  uint in_stack_ffffffffffffff9c;
  CTcDataStream *in_stack_ffffffffffffffa0;
  CTcCodeStream *pCVar2;
  ulong in_stack_ffffffffffffffa8;
  CTcGenTarg *this_01;
  CTcDataStream *in_stack_ffffffffffffffb0;
  ulong in_stack_ffffffffffffffe8;
  CTPNListBase *lst;
  
  lst = in_RDI;
  iVar1 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x282870);
  if (iVar1 == 0) {
    for (this_00 = &CTPNListBase::get_tail(in_RDI)->super_CTPNListEleBase;
        this_00 != (CTPNListEleBase *)0x0;
        this_00 = &CTPNListEleBase::get_prev(this_00)->super_CTPNListEleBase) {
      (**(((CTPNListEleBase *)&this_00->super_CTcPrsNode)->super_CTcPrsNode).super_CTcPrsNodeBase.
         _vptr_CTcPrsNodeBase)(this_00,0);
    }
    iVar1 = CTPNListBase::get_count(in_RDI);
    if (iVar1 < 0x100) {
      CTcGenTarg::write_op(in_stack_00000090,in_stack_0000008f);
      pCVar2 = G_cs;
      iVar1 = CTPNListBase::get_count(in_RDI);
      CTcDataStream::write(&pCVar2->super_CTcDataStream,(int)(char)iVar1,__buf,in_RCX);
      pCVar2 = G_cs;
      iVar1 = CTcGenTarg::get_predef_meta_idx(G_cg,1);
      CTcDataStream::write(&pCVar2->super_CTcDataStream,(int)(char)iVar1,__buf_00,in_RCX);
    }
    else {
      CTcGenTarg::write_op(in_stack_00000090,in_stack_0000008f);
      CTPNListBase::get_count(in_RDI);
      CTcDataStream::write2(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      CTcGenTarg::get_predef_meta_idx(G_cg,1);
      CTcDataStream::write2(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    }
    this_01 = G_cg;
    iVar1 = CTPNListBase::get_count(in_RDI);
    CTcGenTarg::note_pop(this_01,iVar1);
    if (in_ESI == 0) {
      CTcGenTarg::write_op(in_stack_00000090,in_stack_0000008f);
      CTcGenTarg::note_push((CTcGenTarg *)0x282a69);
    }
  }
  else if (in_ESI == 0) {
    CTcGenTarg::write_op(in_stack_00000090,in_stack_0000008f);
    in_RCX = CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
    CTcGenTarg::add_const_list
              (unaff_retaddr,(CTPNList *)lst,(CTcDataStream *)CONCAT44(in_ESI,in_EDX),
               in_stack_ffffffffffffffe8);
    CTcDataStream::write4(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    CTcGenTarg::note_push((CTcGenTarg *)0x2828fa);
  }
  if ((in_ESI == 0) && (((byte)in_RDI->field_0x48 >> 1 & 1) != 0)) {
    CTcGenTarg::write_op(in_stack_00000090,in_stack_0000008f);
    CTcDataStream::write(&G_cs->super_CTcDataStream,1,__buf_01,in_RCX);
    pCVar2 = G_cs;
    iVar1 = CTcGenTarg::get_predef_meta_idx(G_cg,7);
    CTcDataStream::write(&pCVar2->super_CTcDataStream,(int)(char)iVar1,__buf_02,in_RCX);
    CTcGenTarg::note_pop(G_cg,1);
    CTcGenTarg::write_op(in_stack_00000090,in_stack_0000008f);
    CTcGenTarg::note_push((CTcGenTarg *)0x282b1d);
  }
  return;
}

Assistant:

void CTPNList::gen_code(int discard, int for_condition)
{
    /*
     *   Before we construct the list dynamically, check to see if the
     *   list is constant.  If it is, we need only built the list in the
     *   constant pool, and push its offset.  
     */
    if (is_const())
    {
        /* push the value only if we're not discarding it */
        if (!discard)
        {
            /* write the instruction */
            G_cg->write_op(OPC_PUSHLST);

            /* add the list to the constant pool */
            G_cg->add_const_list(this, G_cs, G_cs->get_ofs());

            /* 
             *   write a placeholder address, which will be corrected by
             *   the fixup that add_const_list() created 
             */
            G_cs->write4(0);

            /* note the push */
            G_cg->note_push();
        }
    }
    else
    {
        /*
         *   It's not a constant list, so we must generate code to construct
         *   a list dynamically.  Push each element of the list.  We need
         *   each value (hence discard = false), and we require the
         *   assignable value of each expression (hence for_condition =
         *   false).  Push the argument list in reverse order, since the
         *   run-time metaclass requires this ordering.  
         */
        for (CTPNListEle *ele = get_tail() ; ele != 0 ; ele = ele->get_prev())
            ele->gen_code(FALSE, FALSE);

        /* generate a NEW instruction for an object of metaclass LIST */
        if (get_count() <= 255)
        {
            /* the count will fit in one byte - use the short form */
            G_cg->write_op(OPC_NEW1);
            G_cs->write((char)get_count());
            G_cs->write((char)G_cg->get_predef_meta_idx(TCT3_METAID_LIST));
        }
        else
        {
            /* count doesn't fit in one byte - use the long form */
            G_cg->write_op(OPC_NEW2);
            G_cs->write2(get_count());
            G_cs->write2(G_cg->get_predef_meta_idx(TCT3_METAID_LIST));
        }
        
        /* new1/new2 remove arguments */
        G_cg->note_pop(get_count());

        /* if we're not discarding the value, push it */
        if (!discard)
        {
            G_cg->write_op(OPC_GETR0);
            G_cg->note_push();
        }
    }

    /*
     *   If this is a lookup table list, and we're not discarding the value,
     *   create the actual LookupTable object from the list source.  If we're
     *   discarding the value there's no need to create the object, since
     *   doing so will have no meaningful side effects.  
     */
    if (!discard && is_lookup_table_)
    {
        /* 
         *   To construct the lookup table, we simply pass the list of [key,
         *   value, key, value...] elements to the LookupTable constructor.
         *   The list is already on the stack, so simply call the constructor
         *   with one argument.  
         */
        G_cg->write_op(OPC_NEW1);
        G_cs->write(1);
        G_cs->write((char)G_cg->get_predef_meta_idx(TCT3_METAID_LOOKUP_TABLE));

        /* NEW1 removes arguments */
        G_cg->note_pop(1);

        /* push the result */
        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();
    }
}